

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  char cVar1;
  char cVar2;
  unsigned_long *puVar3;
  char *pcVar4;
  Slice *in_RDX;
  Slice *in_RSI;
  long *in_RDI;
  bool bVar5;
  size_t non_shared;
  size_t min_length;
  size_t shared;
  Slice last_key_piece;
  string *in_stack_ffffffffffffff68;
  Slice *in_stack_ffffffffffffff70;
  long *plVar6;
  undefined8 in_stack_ffffffffffffff78;
  uint32_t v;
  string *in_stack_ffffffffffffff80;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  size_t local_30;
  Slice local_28;
  Slice *local_18;
  Slice *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Slice::Slice(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  v = (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_30 = 0;
  if ((int)in_RDI[8] < *(int *)(*in_RDI + 0x40)) {
    local_40 = Slice::size(&local_28);
    local_48 = Slice::size(local_10);
    puVar3 = std::min<unsigned_long>(&local_40,&local_48);
    local_38 = *puVar3;
    while( true ) {
      bVar5 = false;
      if (local_30 < local_38) {
        cVar1 = Slice::operator[](&local_28,local_30);
        cVar2 = Slice::operator[](local_10,local_30);
        bVar5 = cVar1 == cVar2;
      }
      v = (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (!bVar5) break;
      local_30 = local_30 + 1;
    }
  }
  else {
    std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70,
               (value_type_conflict2 *)in_stack_ffffffffffffff68);
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  Slice::size(local_10);
  PutVarint32(in_stack_ffffffffffffff80,v);
  PutVarint32(in_stack_ffffffffffffff80,v);
  Slice::size(local_18);
  PutVarint32(in_stack_ffffffffffffff80,v);
  plVar6 = in_RDI + 1;
  pcVar4 = Slice::data(local_10);
  std::__cxx11::string::append((char *)plVar6,(ulong)(pcVar4 + local_30));
  plVar6 = in_RDI + 1;
  pcVar4 = Slice::data(local_18);
  Slice::size(local_18);
  std::__cxx11::string::append((char *)plVar6,(ulong)pcVar4);
  std::__cxx11::string::resize((ulong)(in_RDI + 9));
  pcVar4 = Slice::data(local_10);
  std::__cxx11::string::append((char *)(in_RDI + 9),(ulong)(pcVar4 + local_30));
  *(int *)(in_RDI + 8) = (int)in_RDI[8] + 1;
  return;
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back((uint32_t)buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, (uint32_t)shared);
  PutVarint32(&buffer_, (uint32_t)non_shared);
  PutVarint32(&buffer_, (uint32_t)value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}